

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O3

void __thiscall sf2cute::RIFFListChunk::~RIFFListChunk(RIFFListChunk *this)

{
  ~RIFFListChunk(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~RIFFListChunk() = default;